

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Char * getContext(XML_Parser parser)

{
  STRING_POOL *pool;
  NAMED **ppNVar1;
  XML_Char XVar2;
  char cVar3;
  DTD *pDVar4;
  XML_Char *pXVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  XML_Bool XVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  NAMED **ppNVar14;
  NAMED *pNVar15;
  
  pDVar4 = parser->m_dtd;
  if ((pDVar4->defaultPrefix).binding == (BINDING *)0x0) {
    bVar8 = false;
  }
  else {
    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
       (XVar10 = poolGrow(&parser->m_tempPool), XVar10 == '\0')) {
LAB_003ac1e7:
      bVar7 = false;
      bVar8 = false;
    }
    else {
      pXVar5 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar5 + 1;
      *pXVar5 = '=';
      uVar11 = ((pDVar4->defaultPrefix).binding)->uriLen + -1 +
               (uint)(parser->m_namespaceSeparator == '\0');
      if (0 < (int)uVar11) {
        uVar13 = 0;
        do {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar10 = poolGrow(&parser->m_tempPool), XVar10 == '\0')) goto LAB_003ac1e7;
          XVar2 = ((pDVar4->defaultPrefix).binding)->uri[uVar13];
          pXVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = XVar2;
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
      bVar7 = true;
      bVar8 = true;
    }
    if (!bVar7) {
      return (XML_Char *)0x0;
    }
  }
  ppNVar14 = (pDVar4->prefixes).v;
  ppNVar1 = ppNVar14 + (pDVar4->prefixes).size;
  pool = &parser->m_tempPool;
LAB_003ac213:
  do {
    if (ppNVar14 == ppNVar1) {
      pNVar15 = (NAMED *)0x0;
    }
    else {
      pNVar15 = *ppNVar14;
      ppNVar14 = ppNVar14 + 1;
      if (pNVar15 == (NAMED *)0x0) goto LAB_003ac213;
    }
    if (pNVar15 == (NAMED *)0x0) {
      iVar12 = 5;
    }
    else if (pNVar15[1].name == (KEY)0x0) {
      iVar12 = 6;
    }
    else {
      if (bVar8) {
        if (((parser->m_tempPool).ptr != (parser->m_tempPool).end) ||
           (XVar10 = poolGrow(pool), XVar10 != '\0')) {
          pXVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = '\f';
          goto LAB_003ac27d;
        }
      }
      else {
LAB_003ac27d:
        cVar3 = *pNVar15->name;
        pcVar9 = pNVar15->name;
        while (cVar3 != '\0') {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar10 = poolGrow(pool), XVar10 == '\0')) goto LAB_003ac37b;
          cVar3 = *pcVar9;
          pcVar6 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pcVar6 + 1;
          *pcVar6 = cVar3;
          cVar3 = pcVar9[1];
          pcVar9 = pcVar9 + 1;
        }
        if (((parser->m_tempPool).ptr != (parser->m_tempPool).end) ||
           (XVar10 = poolGrow(pool), XVar10 != '\0')) {
          pXVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = '=';
          uVar11 = *(int *)(pNVar15[1].name + 0x28) + -1 +
                   (uint)(parser->m_namespaceSeparator == '\0');
          iVar12 = 0;
          if ((int)uVar11 < 1) {
            bVar8 = true;
          }
          else {
            uVar13 = 0;
            do {
              if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                 (XVar10 = poolGrow(pool), XVar10 == '\0')) {
                iVar12 = 1;
                goto LAB_003ac391;
              }
              XVar2 = *(XML_Char *)(*(long *)(pNVar15[1].name + 0x20) + uVar13);
              pXVar5 = (parser->m_tempPool).ptr;
              (parser->m_tempPool).ptr = pXVar5 + 1;
              *pXVar5 = XVar2;
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
            bVar8 = true;
            iVar12 = 0;
          }
          goto LAB_003ac391;
        }
      }
LAB_003ac37b:
      iVar12 = 1;
    }
LAB_003ac391:
  } while ((iVar12 == 0) || (iVar12 == 6));
  if (iVar12 == 5) {
    ppNVar14 = (pDVar4->generalEntities).v;
    ppNVar1 = ppNVar14 + (pDVar4->generalEntities).size;
LAB_003ac3bb:
    do {
      if (ppNVar14 == ppNVar1) {
        pNVar15 = (NAMED *)0x0;
      }
      else {
        pNVar15 = *ppNVar14;
        ppNVar14 = ppNVar14 + 1;
        if (pNVar15 == (NAMED *)0x0) goto LAB_003ac3bb;
      }
      if (pNVar15 == (NAMED *)0x0) {
        iVar12 = 0xd;
      }
      else if (*(char *)&pNVar15[7].name == '\0') {
        iVar12 = 0xe;
      }
      else {
        if (bVar8) {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar10 = poolGrow(pool), XVar10 == '\0')) {
LAB_003ac483:
            iVar12 = 1;
            goto LAB_003ac488;
          }
          pXVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = '\f';
        }
        iVar12 = 0;
        cVar3 = *pNVar15->name;
        pcVar9 = pNVar15->name;
        while (cVar3 != '\0') {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar10 = poolGrow(pool), XVar10 == '\0')) goto LAB_003ac483;
          cVar3 = *pcVar9;
          pcVar6 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pcVar6 + 1;
          *pcVar6 = cVar3;
          cVar3 = pcVar9[1];
          pcVar9 = pcVar9 + 1;
        }
        bVar8 = true;
      }
LAB_003ac488:
    } while ((iVar12 == 0) || (iVar12 == 0xe));
    if ((iVar12 == 0xd) &&
       (((parser->m_tempPool).ptr != (parser->m_tempPool).end ||
        (XVar10 = poolGrow(pool), XVar10 != '\0')))) {
      pXVar5 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar5 + 1;
      *pXVar5 = '\0';
      return (parser->m_tempPool).start;
    }
  }
  return (XML_Char *)0x0;
}

Assistant:

static const XML_Char *
getContext(XML_Parser parser)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  HASH_TABLE_ITER iter;
  XML_Bool needSep = XML_FALSE;

  if (dtd->defaultPrefix.binding) {
    int i;
    int len;
    if (!poolAppendChar(&tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = dtd->defaultPrefix.binding->uriLen;
    if (namespaceSeparator)
      len--;
    for (i = 0; i < len; i++) {
      if (!poolAppendChar(&tempPool, dtd->defaultPrefix.binding->uri[i])) {
        /* Because of memory caching, I don't believe this line can be
         * executed.
         *
         * This is part of a loop copying the default prefix binding
         * URI into the parser's temporary string pool.  Previously,
         * that URI was copied into the same string pool, with a
         * terminating NUL character, as part of setContext().  When
         * the pool was cleared, that leaves a block definitely big
         * enough to hold the URI on the free block list of the pool.
         * The URI copy in getContext() therefore cannot run out of
         * memory.
         *
         * If the pool is used between the setContext() and
         * getContext() calls, the worst it can do is leave a bigger
         * block on the front of the free list.  Given that this is
         * all somewhat inobvious and program logic can be changed, we
         * don't delete the line but we do exclude it from the test
         * coverage statistics.
         */
        return NULL; /* LCOV_EXCL_LINE */
      }
    }
    needSep = XML_TRUE;
  }

  hashTableIterInit(&iter, &(dtd->prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (!prefix)
      break;
    if (!prefix->binding) {
      /* This test appears to be (justifiable) paranoia.  There does
       * not seem to be a way of injecting a prefix without a binding
       * that doesn't get errored long before this function is called.
       * The test should remain for safety's sake, so we instead
       * exclude the following line from the coverage statistics.
       */
      continue; /* LCOV_EXCL_LINE */
    }
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return NULL;
    for (s = prefix->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return NULL;
    if (!poolAppendChar(&tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = prefix->binding->uriLen;
    if (namespaceSeparator)
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&tempPool, prefix->binding->uri[i]))
        return NULL;
    needSep = XML_TRUE;
  }


  hashTableIterInit(&iter, &(dtd->generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (!e->open)
      continue;
    if (needSep && !poolAppendChar(&tempPool, CONTEXT_SEP))
      return NULL;
    for (s = e->name; *s; s++)
      if (!poolAppendChar(&tempPool, *s))
        return 0;
    needSep = XML_TRUE;
  }

  if (!poolAppendChar(&tempPool, XML_T('\0')))
    return NULL;
  return tempPool.start;
}